

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_Copy(CopyForm1 Copy)

{
  byte bVar1;
  reference this;
  reference pvVar2;
  uint8_t value;
  code *in_RDI;
  Image *in_stack_00000010;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000018;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined8 in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  uint8_t in_stack_ffffffffffffff76;
  uint8_t in_stack_ffffffffffffff77;
  undefined8 in_stack_ffffffffffffff78;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this_00;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff80;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  local_8 = in_RDI;
  Unit_Test::intensityArray((uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff80,(uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffff77,in_stack_ffffffffffffff76
            );
  Test_Helper::uniformImages(in_stack_00000018,in_stack_00000010);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d22a7);
  this_00 = &local_38;
  this = std::
         vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
         ::operator[](this_00,0);
  pvVar2 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this_00,1);
  (*local_8)(this,pvVar2);
  pvVar2 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_38,1);
  value = (uint8_t)((ulong)pvVar2 >> 0x38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  bVar1 = Unit_Test::verifyImage
                    ((Image *)CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)
                                      ),value);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return (bool)(bVar1 & 1);
}

Assistant:

bool form1_Copy(CopyForm1 Copy)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        Copy( input[0], input[1] );

        return verifyImage( input[1], intensity[0] );
    }